

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O2

void __thiscall pbrt::Object::readFrom(Object *this,BinaryReader *binary)

{
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48 [3];
  
  BinaryReader::read<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffffffb0,binary);
  std::__cxx11::string::operator=((string *)&this->name,(string *)&stack0xffffffffffffffb0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  iVar1 = BinaryReader::read<int>(binary);
  iVar3 = 0;
  if (0 < iVar1) {
    iVar3 = iVar1;
  }
  while( true ) {
    bVar4 = iVar3 == 0;
    iVar3 = iVar3 + -1;
    iVar1 = (int)binary;
    if (bVar4) break;
    BinaryReader::read<int>(binary);
    BinaryReader::getEntity<pbrt::Shape>((BinaryReader *)&stack0xffffffffffffffb0,iVar1);
    std::vector<std::shared_ptr<pbrt::Shape>,std::allocator<std::shared_ptr<pbrt::Shape>>>::
    emplace_back<std::shared_ptr<pbrt::Shape>>
              ((vector<std::shared_ptr<pbrt::Shape>,std::allocator<std::shared_ptr<pbrt::Shape>>> *)
               &this->shapes,(shared_ptr<pbrt::Shape> *)&stack0xffffffffffffffb0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_48);
  }
  iVar2 = BinaryReader::read<int>(binary);
  iVar3 = 0;
  if (0 < iVar2) {
    iVar3 = iVar2;
  }
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    BinaryReader::read<int>(binary);
    BinaryReader::getEntity<pbrt::LightSource>((BinaryReader *)&stack0xffffffffffffffb0,iVar1);
    std::
    vector<std::shared_ptr<pbrt::LightSource>,std::allocator<std::shared_ptr<pbrt::LightSource>>>::
    emplace_back<std::shared_ptr<pbrt::LightSource>>
              ((vector<std::shared_ptr<pbrt::LightSource>,std::allocator<std::shared_ptr<pbrt::LightSource>>>
                *)&this->lightSources,(shared_ptr<pbrt::LightSource> *)&stack0xffffffffffffffb0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_48);
  }
  iVar2 = BinaryReader::read<int>(binary);
  iVar3 = 0;
  if (0 < iVar2) {
    iVar3 = iVar2;
  }
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    BinaryReader::read<int>(binary);
    BinaryReader::getEntity<pbrt::Instance>((BinaryReader *)&stack0xffffffffffffffb0,iVar1);
    std::vector<std::shared_ptr<pbrt::Instance>,std::allocator<std::shared_ptr<pbrt::Instance>>>::
    emplace_back<std::shared_ptr<pbrt::Instance>>
              ((vector<std::shared_ptr<pbrt::Instance>,std::allocator<std::shared_ptr<pbrt::Instance>>>
                *)&this->instances,(shared_ptr<pbrt::Instance> *)&stack0xffffffffffffffb0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_48);
  }
  return;
}

Assistant:

void Object::readFrom(BinaryReader &binary) 
  {
    name = binary.read<std::string>();

    // read shapes
    int32_t numShapes = binary.read<int32_t>();
    assert(shapes.empty());
    for (int32_t i=0;i<numShapes;i++)
      shapes.push_back(binary.getEntity<Shape>(binary.read<int32_t>()));

    // read lightSources
    int numLightSources = binary.read<int32_t>();
    assert(lightSources.empty());
    for (int i=0;i<numLightSources;i++)
      lightSources.push_back(binary.getEntity<LightSource>(binary.read<int32_t>()));

    // read instances
    int32_t numInstances = binary.read<int32_t>();
    assert(instances.empty());
    for (int32_t i=0;i<numInstances;i++)
      instances.push_back(binary.getEntity<Instance>(binary.read<int32_t>()));
  }